

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

void __thiscall Application::onMessage(Application *this)

{
  SessionID *in_RDX;
  NewOrderSingle *in_RSI;
  
  onMessage(this + -0x18,in_RSI,in_RDX);
  return;
}

Assistant:

void Application::onMessage(const FIX42::NewOrderSingle &message, const FIX::SessionID &) {
  FIX::SenderCompID senderCompID;
  FIX::TargetCompID targetCompID;
  FIX::ClOrdID clOrdID;
  FIX::Symbol symbol;
  FIX::Side side;
  FIX::OrdType ordType;
  FIX::Price price;
  FIX::OrderQty orderQty;
  FIX::TimeInForce timeInForce(FIX::TimeInForce_DAY);

  message.getHeader().get(senderCompID);
  message.getHeader().get(targetCompID);
  message.get(clOrdID);
  message.get(symbol);
  message.get(side);
  message.get(ordType);
  if (ordType == FIX::OrdType_LIMIT) {
    message.get(price);
  }
  message.get(orderQty);
  message.getFieldIfSet(timeInForce);

  try {
    if (timeInForce != FIX::TimeInForce_DAY) {
      throw std::logic_error("Unsupported TIF, use Day");
    }

    Order order(clOrdID, symbol, senderCompID, targetCompID, convert(side), convert(ordType), price, (long)orderQty);

    processOrder(order);
  } catch (std::exception &e) {
    rejectOrder(senderCompID, targetCompID, clOrdID, symbol, side, e.what());
  }
}